

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespaces.h
# Opt level: O0

Matrix<long_double> * __thiscall
neural_networks::utilities::Matrix<long_double>::transpose(Matrix<long_double> *this)

{
  unkbyte10 Var1;
  size_type __n;
  size_type __n_00;
  const_reference this_00;
  const_reference pvVar2;
  reference this_01;
  reference pvVar3;
  Matrix<long_double> *this_02;
  Matrix<long_double> *to_return;
  size_t j;
  size_t i;
  allocator<long_double> local_41;
  vector<long_double,_std::allocator<long_double>_> local_40;
  undefined1 local_28 [8];
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  temp_vector;
  Matrix<long_double> *this_local;
  
  __n = this->N;
  __n_00 = this->M;
  temp_vector.
  super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<long_double>::allocator(&local_41);
  std::vector<long_double,_std::allocator<long_double>_>::vector(&local_40,__n,&local_41);
  std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>::allocator
            ((allocator<std::vector<long_double,_std::allocator<long_double>_>_> *)((long)&i + 3));
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::vector((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
            *)local_28,__n_00,&local_40,
           (allocator<std::vector<long_double,_std::allocator<long_double>_>_> *)((long)&i + 3));
  std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>::~allocator
            ((allocator<std::vector<long_double,_std::allocator<long_double>_>_> *)((long)&i + 3));
  std::vector<long_double,_std::allocator<long_double>_>::~vector(&local_40);
  std::allocator<long_double>::~allocator(&local_41);
  for (j = 0; j < this->N; j = j + 1) {
    for (to_return = (Matrix<long_double> *)0x0; to_return < (Matrix<long_double> *)this->M;
        to_return = (Matrix<long_double> *)((long)&to_return->_vptr_Matrix + 1)) {
      this_00 = std::
                vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ::operator[](&this->matrix,j);
      pvVar2 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                         (this_00,(size_type)to_return);
      Var1 = *(unkbyte10 *)pvVar2;
      this_01 = std::
                vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                              *)local_28,(size_type)to_return);
      pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[](this_01,j);
      *(unkbyte10 *)pvVar3 = Var1;
    }
  }
  this_02 = (Matrix<long_double> *)operator_new(0x30);
  Matrix(this_02,(vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  *)local_28);
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::~vector((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
             *)local_28);
  return this_02;
}

Assistant:

neural_networks::utilities::Matrix<T>* neural_networks::utilities::Matrix<T>::transpose() const {
    std::vector< std::vector<T> > temp_vector(M, std::vector<T>(N));
    register size_t i, j;
    for(i = 0; i < N; ++i) {
        for(j = 0; j < M; ++j) {
            temp_vector[j][i] = matrix[i][j];
        }
    }
    neural_networks::utilities::Matrix<T> *to_return = new neural_networks::utilities::Matrix<T>(temp_vector);
    return to_return;
}